

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH35
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  uint8_t uVar1;
  uint uVar2;
  size_t sVar3;
  uint32_t *puVar4;
  int iVar5;
  byte bVar6;
  Command *pCVar7;
  uint32_t uVar8;
  uint uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  long lVar18;
  byte bVar19;
  HROLLING_FAST *pHVar20;
  uint8_t *local_dd0;
  uint8_t *local_db8;
  uint8_t *local_da0;
  uint8_t *local_d98;
  uint8_t *local_d88;
  uint8_t *local_d70;
  uint8_t *local_d48;
  ulong local_d40;
  ulong local_d38;
  uint8_t *local_d20;
  uint8_t *local_d08;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_c78;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t dictionary_start;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t position_offset;
  size_t max_backward_limit;
  H35 *privat;
  BrotliEncoderParams *params_local;
  ContextLut literal_context_lut_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_ae0;
  uint32_t delta;
  size_t nbits;
  size_t offset;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_9ca;
  uint32_t nbits_2;
  ushort local_9a2;
  uint32_t offset_1;
  uint16_t bits64;
  ushort local_97a;
  size_t b_5;
  size_t a_5;
  size_t b_4;
  size_t a_4;
  size_t b_1;
  size_t a_1;
  size_t b;
  size_t a;
  size_t b_3;
  size_t a_3;
  size_t b_2;
  size_t a_2;
  size_t score_4;
  size_t backward_2;
  size_t len_4;
  size_t i_1;
  size_t keys_1 [2];
  size_t score_3;
  size_t len_3;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t key_out_1;
  size_t key_1;
  int compare_char_1;
  size_t cur_ix_masked_2;
  size_t best_len_in_1;
  uint32_t *buckets_1;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_730;
  size_t local_720;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_6f0;
  size_t local_6e0;
  size_t score_1;
  size_t backward;
  size_t len_1;
  size_t i;
  size_t keys [2];
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t key_out;
  size_t key;
  int compare_char;
  size_t cur_ix_masked;
  size_t best_len_in;
  uint32_t *buckets;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_4d0;
  size_t local_4c0;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_490;
  size_t local_480;
  uint8_t *local_3f0;
  size_t i_2;
  uint32_t off;
  uint32_t key_2;
  uint32_t off_2;
  uint32_t key_4;
  uint32_t off_1;
  uint32_t key_3;
  size_t score_2;
  size_t len_2;
  size_t found_ix_masked;
  size_t backward_1;
  size_t found_ix;
  uint8_t add;
  uint8_t rem;
  uint8_t *puStack_2b8;
  uint32_t code;
  size_t pos;
  size_t cur_ix_masked_1;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_210;
  size_t local_200;
  size_t score_5;
  size_t len_5;
  size_t found_ix_masked_1;
  size_t backward_3;
  size_t found_ix_1;
  uint8_t add_1;
  uint8_t rem_1;
  uint8_t *puStack_190;
  uint32_t code_1;
  size_t pos_1;
  size_t cur_ix_masked_3;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_e8;
  size_t local_d8;
  
  pCVar7 = commands;
  puVar11 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  sVar3 = params->stream_offset;
  pos_end = *last_insert_len;
  puVar12 = (uint8_t *)(position + num_bytes);
  local_d08 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_d08 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar10 = 0x200;
  if (params->quality < 9) {
    iVar10 = 0x40;
  }
  lVar13 = (long)iVar10;
  gap = position + lVar13;
  puVar16 = (uint8_t *)position;
LAB_00125d79:
  do {
    ringbuffer_local = puVar16;
    if (puVar12 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar12 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar7 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar12 - (long)ringbuffer_local;
    local_d20 = puVar11;
    if (ringbuffer_local < puVar11) {
      local_d20 = ringbuffer_local;
    }
    sr.len = 0;
    sr.score = 0;
    puVar4 = (hasher->privat)._H2.buckets_;
    cached_backward = 0;
    uVar14 = (ulong)ringbuffer_local & ringbuffer_mask;
    uVar1 = ringbuffer[uVar14];
    uVar8 = HashBytesH3(ringbuffer + uVar14);
    best_len = 0x7e4;
    sr.score._0_4_ = 0;
    if ((ringbuffer_local + -(long)*dist_cache < ringbuffer_local) &&
       (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(ringbuffer_local + -(long)*dist_cache),
       uVar1 == ringbuffer[uVar15])) {
      local_490 = (ulong *)(ringbuffer + uVar14);
      limit2 = 0;
      x = (max_distance >> 3) + 1;
LAB_00126204:
      x = x - 1;
      if (x != 0) {
        if (*local_490 == *(ulong *)(ringbuffer + limit2 + uVar15)) break;
        iVar10 = 0;
        for (uVar15 = *local_490 ^ *(ulong *)(ringbuffer + limit2 + uVar15); (uVar15 & 1) == 0;
            uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          iVar10 = iVar10 + 1;
        }
        local_480 = ((ulong)(long)iVar10 >> 3) + limit2;
        goto LAB_001263a7;
      }
      matched = (max_distance & 7) + 1;
      while (matched = matched - 1, matched != 0) {
        if (ringbuffer[limit2 + uVar15] != (uint8_t)*local_490) {
          local_480 = limit2;
          goto LAB_001263a7;
        }
        local_490 = (ulong *)((long)local_490 + 1);
        limit2 = limit2 + 1;
      }
      local_480 = limit2;
LAB_001263a7:
      if ((3 < local_480) && (uVar15 = local_480 * 0x87 + 0x78f, 0x7e4 < uVar15)) {
        cached_backward = local_480;
        uVar1 = ringbuffer[uVar14 + local_480];
        sr.len = (long)*dist_cache;
        best_len = uVar15;
      }
    }
    for (len_1 = 0; len_1 < 2; len_1 = len_1 + 1) {
      keys[len_1 - 1] = (ulong)uVar8 + len_1 * 8 & 0xffff;
    }
    sStack_c78 = cached_backward;
    sr.distance = best_len;
    for (len_1 = 0; len_1 < 2; len_1 = len_1 + 1) {
      uVar15 = (ulong)puVar4[keys[len_1 - 1]];
      puVar16 = ringbuffer_local + -uVar15;
      uVar15 = ringbuffer_mask & 0xffffffff & uVar15;
      if ((uVar1 == ringbuffer[uVar15 + cached_backward]) &&
         (puVar16 != (uint8_t *)0x0 && puVar16 <= local_d20)) {
        local_4d0 = (ulong *)(ringbuffer + uVar14);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_00126605:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_4d0 == *(ulong *)(ringbuffer + limit2_1 + uVar15)) goto LAB_00126667;
          iVar10 = 0;
          for (uVar15 = *local_4d0 ^ *(ulong *)(ringbuffer + limit2_1 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          local_4c0 = ((ulong)(long)iVar10 >> 3) + limit2_1;
          goto LAB_001267a8;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar15] != (uint8_t)*local_4d0) {
            local_4c0 = limit2_1;
            goto LAB_001267a8;
          }
          local_4d0 = (ulong *)((long)local_4d0 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_4c0 = limit2_1;
LAB_001267a8:
        if (3 < local_4c0) {
          iVar10 = 0x1f;
          if ((uint)puVar16 != 0) {
            for (; (uint)puVar16 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          uVar15 = (local_4c0 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
          if (best_len < uVar15) {
            cached_backward = local_4c0;
            sStack_c78 = local_4c0;
            uVar1 = ringbuffer[uVar14 + local_4c0];
            sr.len = (size_t)puVar16;
            sr.distance = uVar15;
            best_len = uVar15;
          }
        }
      }
    }
    puVar4[*(long *)((long)keys + (((ulong)ringbuffer_local & 8) - 8))] = (uint32_t)ringbuffer_local
    ;
    pHVar20 = &(hasher->privat)._H35.hb;
    if ((((ulong)ringbuffer_local & 3) == 0) && (0x1f < max_distance)) {
      for (puStack_2b8 = *(uint8_t **)&(hasher->privat)._H65.ha.block_mask_;
          puStack_2b8 <= ringbuffer_local; puStack_2b8 = puStack_2b8 + 4) {
        uVar9 = pHVar20->state & 0x3fffffff;
        uVar8 = HashRollingFunctionHROLLING_FAST
                          (pHVar20->state,ringbuffer[(ulong)(puStack_2b8 + 0x20) & ringbuffer_mask],
                           ringbuffer[(ulong)puStack_2b8 & ringbuffer_mask],
                           (hasher->privat)._H35.hb.factor,(hasher->privat)._H35.hb.factor_remove);
        pHVar20->state = uVar8;
        if (uVar9 < 0x1000000) {
          uVar2 = *(uint *)((long)&((hasher->privat)._H40.common)->extra + (ulong)uVar9 * 4);
          *(int *)((long)&((hasher->privat)._H40.common)->extra + (ulong)uVar9 * 4) =
               (int)puStack_2b8;
          if ((puStack_2b8 == ringbuffer_local) && ((ulong)uVar2 != 0xffffffff)) {
            uVar9 = (uint32_t)ringbuffer_local - uVar2;
            if ((uint8_t *)(ulong)uVar9 <= local_d20) {
              uVar14 = uVar2 & ringbuffer_mask;
              local_210 = (ulong *)(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
              limit2_2 = 0;
              x_2 = (max_distance >> 3) + 1;
LAB_00126ba2:
              x_2 = x_2 - 1;
              if (x_2 != 0) {
                if (*local_210 == *(ulong *)(ringbuffer + limit2_2 + uVar14)) goto LAB_00126c04;
                iVar10 = 0;
                for (uVar14 = *local_210 ^ *(ulong *)(ringbuffer + limit2_2 + uVar14);
                    (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                  iVar10 = iVar10 + 1;
                }
                local_200 = ((ulong)(long)iVar10 >> 3) + limit2_2;
                goto LAB_00126d45;
              }
              matched_2 = (max_distance & 7) + 1;
              while (matched_2 = matched_2 - 1, matched_2 != 0) {
                if (ringbuffer[limit2_2 + uVar14] != (uint8_t)*local_210) {
                  local_200 = limit2_2;
                  goto LAB_00126d45;
                }
                local_210 = (ulong *)((long)local_210 + 1);
                limit2_2 = limit2_2 + 1;
              }
              local_200 = limit2_2;
LAB_00126d45:
              if ((3 < local_200) && (sStack_c78 < local_200)) {
                iVar10 = 0x1f;
                if (uVar9 != 0) {
                  for (; uVar9 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                uVar14 = (local_200 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                if (sr.distance < uVar14) {
                  sStack_c78 = local_200;
                  sr.score._0_4_ = 0;
                  sr.len = (size_t)(ulong)uVar9;
                  sr.distance = uVar14;
                }
              }
            }
          }
        }
      }
      (hasher->privat)._H5.common_ = (HasherCommon *)(ringbuffer_local + 4);
    }
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      puVar16 = ringbuffer_local;
      if (sr.score._4_4_ == 0) {
        do {
          max_distance = max_distance - 1;
          if (params->quality < 5) {
            local_d38 = sStack_c78 - 1;
            if (max_distance <= local_d38) {
              local_d38 = max_distance;
            }
            local_d40 = local_d38;
          }
          else {
            local_d40 = 0;
          }
          sr2.len = 0;
          local_d48 = puVar11;
          if (ringbuffer_local + 1 < puVar11) {
            local_d48 = ringbuffer_local + 1;
          }
          puVar16 = ringbuffer_local + 1;
          puVar4 = (hasher->privat)._H2.buckets_;
          cached_backward_1 = local_d40;
          uVar14 = (ulong)puVar16 & ringbuffer_mask;
          uVar1 = ringbuffer[uVar14 + local_d40];
          uVar8 = HashBytesH3(ringbuffer + uVar14);
          best_len_1 = 0x7e4;
          distance_code = 0;
          if ((puVar16 + -(long)*dist_cache < puVar16) &&
             (uVar15 = ringbuffer_mask & 0xffffffff & (ulong)(puVar16 + -(long)*dist_cache),
             uVar1 == ringbuffer[uVar15 + local_d40])) {
            local_6f0 = (ulong *)(ringbuffer + uVar14);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_00127330:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_6f0 == *(ulong *)(ringbuffer + limit2_3 + uVar15)) goto LAB_00127392;
              iVar10 = 0;
              for (uVar15 = *local_6f0 ^ *(ulong *)(ringbuffer + limit2_3 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar10 = iVar10 + 1;
              }
              local_6e0 = ((ulong)(long)iVar10 >> 3) + limit2_3;
              goto LAB_001274d3;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar15] != (uint8_t)*local_6f0) {
                local_6e0 = limit2_3;
                goto LAB_001274d3;
              }
              local_6f0 = (ulong *)((long)local_6f0 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_6e0 = limit2_3;
LAB_001274d3:
            if ((3 < local_6e0) && (uVar15 = local_6e0 * 0x87 + 0x78f, 0x7e4 < uVar15)) {
              distance_code = local_6e0;
              cached_backward_1 = local_6e0;
              uVar1 = ringbuffer[uVar14 + local_6e0];
              sr2.len = (long)*dist_cache;
              best_len_1 = uVar15;
            }
          }
          for (len_4 = 0; len_4 < 2; len_4 = len_4 + 1) {
            keys_1[len_4 - 1] = (ulong)uVar8 + len_4 * 8 & 0xffff;
          }
          sr2.distance = best_len_1;
          for (len_4 = 0; len_4 < 2; len_4 = len_4 + 1) {
            uVar15 = (ulong)puVar4[keys_1[len_4 - 1]];
            puVar17 = puVar16 + -uVar15;
            uVar15 = ringbuffer_mask & 0xffffffff & uVar15;
            if ((uVar1 == ringbuffer[uVar15 + cached_backward_1]) &&
               (puVar17 != (uint8_t *)0x0 && puVar17 <= local_d48)) {
              local_730 = (ulong *)(ringbuffer + uVar14);
              limit2_4 = 0;
              x_4 = (max_distance >> 3) + 1;
LAB_00127731:
              x_4 = x_4 - 1;
              if (x_4 != 0) {
                if (*local_730 == *(ulong *)(ringbuffer + limit2_4 + uVar15)) goto LAB_00127793;
                iVar10 = 0;
                for (uVar15 = *local_730 ^ *(ulong *)(ringbuffer + limit2_4 + uVar15);
                    (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                  iVar10 = iVar10 + 1;
                }
                local_720 = ((ulong)(long)iVar10 >> 3) + limit2_4;
                goto LAB_001278d4;
              }
              matched_4 = (max_distance & 7) + 1;
              while (matched_4 = matched_4 - 1, matched_4 != 0) {
                if (ringbuffer[limit2_4 + uVar15] != (uint8_t)*local_730) {
                  local_720 = limit2_4;
                  goto LAB_001278d4;
                }
                local_730 = (ulong *)((long)local_730 + 1);
                limit2_4 = limit2_4 + 1;
              }
              local_720 = limit2_4;
LAB_001278d4:
              if (3 < local_720) {
                iVar10 = 0x1f;
                if ((uint)puVar17 != 0) {
                  for (; (uint)puVar17 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                  }
                }
                uVar15 = (local_720 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                if (best_len_1 < uVar15) {
                  cached_backward_1 = local_720;
                  distance_code = local_720;
                  uVar1 = ringbuffer[uVar14 + local_720];
                  sr2.len = (size_t)puVar17;
                  sr2.distance = uVar15;
                  best_len_1 = uVar15;
                }
              }
            }
          }
          puVar4[*(long *)((long)keys_1 + (((ulong)puVar16 & 8) - 8))] = (uint32_t)puVar16;
          pHVar20 = &(hasher->privat)._H35.hb;
          if ((((ulong)puVar16 & 3) == 0) && (0x1f < max_distance)) {
            for (puStack_190 = *(uint8_t **)&(hasher->privat)._H65.ha.block_mask_;
                puStack_190 <= puVar16; puStack_190 = puStack_190 + 4) {
              uVar9 = pHVar20->state & 0x3fffffff;
              uVar8 = HashRollingFunctionHROLLING_FAST
                                (pHVar20->state,
                                 ringbuffer[(ulong)(puStack_190 + 0x20) & ringbuffer_mask],
                                 ringbuffer[(ulong)puStack_190 & ringbuffer_mask],
                                 (hasher->privat)._H35.hb.factor,
                                 (hasher->privat)._H35.hb.factor_remove);
              pHVar20->state = uVar8;
              if (uVar9 < 0x1000000) {
                uVar2 = *(uint *)((long)&((hasher->privat)._H40.common)->extra + (ulong)uVar9 * 4);
                *(int *)((long)&((hasher->privat)._H40.common)->extra + (ulong)uVar9 * 4) =
                     (int)puStack_190;
                if ((puStack_190 == puVar16) && ((ulong)uVar2 != 0xffffffff)) {
                  uVar9 = (uint32_t)puVar16 - uVar2;
                  if ((uint8_t *)(ulong)uVar9 <= local_d48) {
                    uVar14 = uVar2 & ringbuffer_mask;
                    local_e8 = (ulong *)(ringbuffer + ((ulong)puVar16 & ringbuffer_mask));
                    limit2_5 = 0;
                    x_5 = (max_distance >> 3) + 1;
LAB_00127cce:
                    x_5 = x_5 - 1;
                    if (x_5 != 0) {
                      if (*local_e8 == *(ulong *)(ringbuffer + limit2_5 + uVar14))
                      goto LAB_00127d30;
                      iVar10 = 0;
                      for (uVar14 = *local_e8 ^ *(ulong *)(ringbuffer + limit2_5 + uVar14);
                          (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                        iVar10 = iVar10 + 1;
                      }
                      local_d8 = ((ulong)(long)iVar10 >> 3) + limit2_5;
                      goto LAB_00127e71;
                    }
                    matched_5 = (max_distance & 7) + 1;
                    while (matched_5 = matched_5 - 1, matched_5 != 0) {
                      if (ringbuffer[limit2_5 + uVar14] != (uint8_t)*local_e8) {
                        local_d8 = limit2_5;
                        goto LAB_00127e71;
                      }
                      local_e8 = (ulong *)((long)local_e8 + 1);
                      limit2_5 = limit2_5 + 1;
                    }
                    local_d8 = limit2_5;
LAB_00127e71:
                    if ((3 < local_d8) && (distance_code < local_d8)) {
                      iVar10 = 0x1f;
                      if (uVar9 != 0) {
                        for (; uVar9 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                        }
                      }
                      uVar14 = (local_d8 * 0x87 + 0x780) - (ulong)(uint)(iVar10 * 0x1e);
                      if (sr2.distance < uVar14) {
                        distance_code = local_d8;
                        sr2.len = (size_t)(ulong)uVar9;
                        sr2.distance = uVar14;
                      }
                    }
                  }
                }
              }
            }
            (hasher->privat)._H5.common_ = (HasherCommon *)(ringbuffer_local + 5);
          }
          puVar16 = ringbuffer_local;
          if (sr2.distance < sr.distance + 0xaf) break;
          puVar16 = ringbuffer_local + 1;
          pos_end = pos_end + 1;
          sStack_c78 = distance_code;
          sr.len = sr2.len;
          sr.distance = sr2.distance;
          sr.score = 0;
          cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
          if ((3 < cost_diff_lazy._4_4_) ||
             (puVar17 = ringbuffer_local + 9, ringbuffer_local = puVar16, puVar12 <= puVar17))
          break;
        } while( true );
      }
      ringbuffer_local = puVar16;
      gap = (size_t)(ringbuffer_local + lVar13 + sStack_c78 * 2);
      local_d70 = puVar11;
      if (ringbuffer_local + sVar3 < puVar11) {
        local_d70 = ringbuffer_local + sVar3;
      }
      if (local_d70 < sr.len) {
LAB_001282c4:
        local_ae0 = sr.len + 0xf;
      }
      else {
        uVar14 = (sr.len + 3) - (long)*dist_cache;
        uVar15 = (sr.len + 3) - (long)dist_cache[1];
        if (sr.len == (long)*dist_cache) {
          local_ae0 = 0;
        }
        else if (sr.len == (long)dist_cache[1]) {
          local_ae0 = 1;
        }
        else if (uVar14 < 7) {
          local_ae0 = (ulong)(int)(0x9750468 >> ((byte)((uVar14 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (uVar15 < 7) {
          local_ae0 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar15 & 0x3fffffff) << 2) & 0x1f) & 0xf);
        }
        else if (sr.len == (long)dist_cache[2]) {
          local_ae0 = 2;
        }
        else {
          if (sr.len != (long)dist_cache[3]) goto LAB_001282c4;
          local_ae0 = 3;
        }
      }
      if ((sr.len <= local_d70) && (local_ae0 != 0)) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = *dist_cache;
        *dist_cache = (int)sr.len;
      }
      uVar8 = (uint32_t)pos_end;
      commands->insert_len_ = uVar8;
      commands->copy_len_ = (uint)sStack_c78 | (int)sr.score << 0x19;
      uVar9 = (params->dist).num_direct_distance_codes;
      uVar2 = (params->dist).distance_postfix_bits;
      if (local_ae0 < (ulong)uVar9 + 0x10) {
        commands->dist_prefix_ = (uint16_t)local_ae0;
        commands->dist_extra_ = 0;
      }
      else {
        bVar6 = (byte)uVar2;
        uVar14 = (1L << (bVar6 + 2 & 0x3f)) + ((local_ae0 - 0x10) - (ulong)uVar9);
        iVar10 = 0x1f;
        if ((uint)uVar14 != 0) {
          for (; (uint)uVar14 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        bVar19 = (byte)(iVar10 - 1U);
        uVar15 = uVar14 >> (bVar19 & 0x3f) & 1;
        lVar18 = (ulong)(iVar10 - 1U) - (ulong)uVar2;
        commands->dist_prefix_ =
             (short)lVar18 * 0x400 |
             (short)uVar9 + 0x10 + (short)((lVar18 + -1) * 2 + uVar15 << (bVar6 & 0x3f)) +
             ((ushort)uVar14 & (short)(1 << (bVar6 & 0x1f)) - 1U);
        commands->dist_extra_ =
             (uint32_t)(uVar14 - (uVar15 + 2 << (bVar19 & 0x3f)) >> (bVar6 & 0x3f));
      }
      iVar10 = (uint)sStack_c78 + (int)sr.score;
      uVar14 = (ulong)iVar10;
      if (pos_end < 6) {
        local_9ca = (ushort)pos_end;
      }
      else if (pos_end < 0x82) {
        iVar5 = 0x1f;
        if (uVar8 - 2 != 0) {
          for (; uVar8 - 2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_9ca = (short)(iVar5 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar5 + -1) & 0x3f)) +
                    2;
      }
      else if (pos_end < 0x842) {
        iVar5 = 0x1f;
        if (uVar8 - 0x42 != 0) {
          for (; uVar8 - 0x42 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_9ca = (short)iVar5 + 10;
      }
      else if (pos_end < 0x1842) {
        local_9ca = 0x15;
      }
      else if (pos_end < 0x5842) {
        local_9ca = 0x16;
      }
      else {
        local_9ca = 0x17;
      }
      if (uVar14 < 10) {
        local_9a2 = (short)iVar10 - 2;
      }
      else if (uVar14 < 0x86) {
        iVar5 = 0x1f;
        if (iVar10 - 6U != 0) {
          for (; iVar10 - 6U >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_9a2 = (short)(iVar5 + -1) * 2 + (short)(uVar14 - 6 >> ((byte)(iVar5 + -1) & 0x3f)) + 4
        ;
      }
      else if (uVar14 < 0x846) {
        iVar5 = 0x1f;
        if (iVar10 - 0x46U != 0) {
          for (; iVar10 - 0x46U >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        local_9a2 = (short)iVar5 + 0xc;
      }
      else {
        local_9a2 = 0x17;
      }
      local_97a = local_9a2 & 7 | (local_9ca & 7) << 3;
      if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_9ca < 8)) && (local_9a2 < 0x10)) {
        if (7 < local_9a2) {
          local_97a = local_97a | 0x40;
        }
      }
      else {
        iVar10 = ((int)(uint)local_9a2 >> 3) + ((int)(uint)local_9ca >> 3) * 3;
        local_97a = (short)iVar10 * 0x40 + 0x40 +
                    ((ushort)(0x520d40 >> ((char)iVar10 * '\x02' & 0x1fU)) & 0xc0) | local_97a;
      }
      commands->cmd_prefix_ = local_97a;
      *num_literals = pos_end + *num_literals;
      pos_end = 0;
      range_end = (size_t)(ringbuffer_local + 2);
      local_d88 = ringbuffer_local + sStack_c78;
      if (local_d08 <= local_d88) {
        local_d88 = local_d08;
      }
      if (sr.len < sStack_c78 >> 2) {
        local_d98 = ringbuffer_local + sr.len * -4 + sStack_c78;
        if (local_d98 < range_end) {
          local_d98 = (uint8_t *)range_end;
        }
        if (local_d88 < local_d98) {
          local_da0 = local_d88;
        }
        else {
          local_da0 = local_d98;
        }
        range_end = (size_t)local_da0;
      }
      for (local_3f0 = (uint8_t *)range_end; local_3f0 < local_d88; local_3f0 = local_3f0 + 1) {
        uVar8 = HashBytesH3(ringbuffer + ((ulong)local_3f0 & ringbuffer_mask));
        (hasher->privat)._H2.buckets_[uVar8 + ((uint)local_3f0 & 8) & 0xffff] = (uint)local_3f0;
      }
      commands = commands + 1;
      puVar16 = ringbuffer_local + sStack_c78;
      goto LAB_00125d79;
    }
    pos_end = pos_end + 1;
    puVar16 = ringbuffer_local + 1;
    if ((gap < puVar16) && (back_refs_size == 0)) {
      if ((uint8_t *)(gap + lVar13 * 4) < puVar16) {
        puVar17 = ringbuffer_local + 0x11;
        local_db8 = puVar12 + -7;
        ringbuffer_local = puVar16;
        if (puVar17 < local_db8) {
          local_db8 = puVar17;
        }
        for (; puVar16 = ringbuffer_local, ringbuffer_local < local_db8;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar8 = HashBytesH3(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar8 + ((uint)ringbuffer_local & 8) & 0xffff] =
               (uint)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar17 = ringbuffer_local + 9;
        local_dd0 = puVar12 + -7;
        ringbuffer_local = puVar16;
        if (puVar17 < local_dd0) {
          local_dd0 = puVar17;
        }
        for (; puVar16 = ringbuffer_local, ringbuffer_local < local_dd0;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar8 = HashBytesH3(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          (hasher->privat)._H2.buckets_[uVar8 + ((uint)ringbuffer_local & 8) & 0xffff] =
               (uint)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
  local_490 = local_490 + 1;
  limit2 = limit2 + 8;
  goto LAB_00126204;
LAB_00126667:
  local_4d0 = local_4d0 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00126605;
LAB_00126c04:
  local_210 = local_210 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00126ba2;
LAB_00127392:
  local_6f0 = local_6f0 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00127330;
LAB_00127793:
  local_730 = local_730 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_00127731;
LAB_00127d30:
  local_e8 = local_e8 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_00127cce;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}